

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

char * absl::lts_20250127::anon_unknown_1::Format64(char *ep,int width,int64_t v)

{
  ulong uVar1;
  
  do {
    width = width + -1;
    ep[-1] = (char)(v % 10) + '0';
    ep = ep + -1;
    uVar1 = v + 9;
    v = v / 10;
  } while (0x12 < uVar1);
  for (; 0 < width; width = width + -1) {
    ep[-1] = '0';
    ep = ep + -1;
  }
  return ep;
}

Assistant:

char* Format64(char* ep, int width, int64_t v) {
  do {
    --width;
    *--ep = static_cast<char>('0' + (v % 10));  // contiguous digits
  } while (v /= 10);
  while (--width >= 0) *--ep = '0';  // zero pad
  return ep;
}